

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O2

void __thiscall xcardMT::xcardMT(xcardMT *this,string *prefix,int threads,int debug)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"-1",&local_41);
  xcard::xcard(&this->super_xcard,&local_40,0);
  std::__cxx11::string::~string((string *)&local_40);
  this->max_threads = -1;
  std::__cxx11::string::_M_assign((string *)this);
  (this->super_xcard).debug = debug;
  if (0 < threads) {
    this->max_threads = threads;
  }
  return;
}

Assistant:

xcardMT::xcardMT(std::string prefix, int threads, int debug)
{

    this->prefix = prefix;
    this->debug = debug;
    
    if (threads > 0){
    this->max_threads = threads;
    }
}